

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.cpp
# Opt level: O1

MultiIndexSet *
TasGrid::MultiIndexManipulations::generateNonNestedPoints
          (MultiIndexSet *__return_storage_ptr__,MultiIndexSet *tensors,
          OneDimensionalWrapper *wrapper)

{
  pointer pMVar1;
  MultiIndexSet *pMVar2;
  size_type __n;
  size_t sVar3;
  pointer piVar4;
  pointer piVar5;
  bool bVar6;
  int iVar7;
  iterator __begin3;
  pointer piVar8;
  int d;
  uint uVar9;
  size_type sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  pointer piVar15;
  int iVar16;
  long lVar17;
  vector<int,_std::allocator<int>_> num_entries;
  vector<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_> point_tensors;
  Data2D<int> raw_points;
  vector<int,_std::allocator<int>_> local_d8;
  vector<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_> local_c0;
  Data2D<int> local_a8;
  MultiIndexSet *local_80;
  long local_78;
  size_type local_70;
  MultiIndexSet *local_68;
  size_type local_60;
  MultiIndexSet local_58;
  
  __n = tensors->num_dimensions;
  sVar10 = (size_type)tensors->cache_num_indexes;
  local_80 = __return_storage_ptr__;
  local_68 = tensors;
  std::vector<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>::vector
            (&local_c0,sVar10,(allocator_type *)&local_a8);
  local_70 = sVar10;
  if (0 < (long)sVar10) {
    local_78 = __n * 4 + -4;
    lVar17 = 0;
    sVar10 = 0;
    do {
      local_60 = sVar10;
      ::std::vector<int,_std::allocator<int>_>::vector(&local_d8,__n,(allocator_type *)&local_a8);
      sVar3 = local_68->num_dimensions;
      piVar4 = (local_68->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (__n != 0) {
        piVar8 = (wrapper->num_points).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar14 = 0;
        do {
          *(int *)((long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14) =
               piVar8[*(int *)((long)piVar4 + lVar14 + sVar3 * lVar17)];
          lVar14 = lVar14 + 4;
        } while (__n * 4 - lVar14 != 0);
      }
      iVar16 = 1;
      for (piVar8 = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar8 != local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish; piVar8 = piVar8 + 1) {
        iVar16 = iVar16 * *piVar8;
      }
      local_a8.num_strips = (size_t)iVar16;
      local_a8.stride = __n;
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_a8.vec,local_a8.num_strips * __n,(allocator_type *)&local_58);
      if (0 < iVar16) {
        piVar8 = (wrapper->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5 = (wrapper->indx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar15 = local_a8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        do {
          if (__n != 0) {
            lVar14 = 0;
            iVar7 = iVar16 + -1;
            do {
              piVar15[-1] = piVar5[(long)(iVar7 % local_d8.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish
                                                  [lVar14 + -1]) +
                                   (long)piVar8[*(int *)((long)piVar4 +
                                                        lVar14 * 4 + sVar3 * lVar17 + local_78)]];
              iVar7 = iVar7 / local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish[lVar14 + -1];
              piVar15 = piVar15 + -1;
              lVar14 = lVar14 + -1;
            } while (-lVar14 != __n);
          }
          bVar6 = 1 < iVar16;
          iVar16 = iVar16 + -1;
        } while (bVar6);
      }
      MultiIndexSet::MultiIndexSet(&local_58,&local_a8);
      sVar10 = local_60;
      pMVar1 = local_c0.
               super__Vector_base<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>.
               _M_impl.super__Vector_impl_data._M_start + local_60;
      pMVar1->cache_num_indexes = local_58.cache_num_indexes;
      pMVar1->num_dimensions = local_58.num_dimensions;
      ::std::vector<int,_std::allocator<int>_>::operator=(&pMVar1->indexes,&local_58.indexes);
      if (local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_a8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_a8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      sVar10 = sVar10 + 1;
      lVar17 = lVar17 + 4;
    } while (sVar10 != local_70);
  }
  if (0x28 < (long)local_c0.
                   super__Vector_base<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_c0.
                   super__Vector_base<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
    uVar11 = ((ulong)((long)local_c0.
                            super__Vector_base<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_c0.
                           super__Vector_base<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x3333333333333333;
    do {
      uVar9 = (uint)uVar11 & 1;
      uVar12 = (uVar11 >> 1) + (ulong)uVar9;
      if (uVar12 != 0) {
        lVar17 = 0;
        uVar13 = 0;
        do {
          if ((long)(uVar12 + uVar13) < (long)uVar11) {
            pMVar2 = (MultiIndexSet *)
                     ((long)&(local_c0.
                              super__Vector_base<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>
                              ._M_impl.super__Vector_impl_data._M_start)->num_dimensions + lVar17);
            *(undefined8 *)
             ((long)&(local_c0.
                      super__Vector_base<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>
                      ._M_impl.super__Vector_impl_data._M_start)->num_dimensions + lVar17) =
                 *(undefined8 *)((long)&pMVar2[uVar11 >> 1].num_dimensions + (ulong)(uVar9 * 0x28));
            MultiIndexSet::addSortedIndexes(pMVar2,&pMVar2[uVar12].indexes);
          }
          uVar13 = uVar13 + 1;
          lVar17 = lVar17 + 0x28;
        } while (uVar12 != uVar13);
      }
      uVar11 = uVar12;
    } while (1 < uVar12);
  }
  pMVar2 = local_80;
  local_80->cache_num_indexes =
       (local_c0.super__Vector_base<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>
        ._M_impl.super__Vector_impl_data._M_start)->cache_num_indexes;
  local_80->num_dimensions =
       (local_c0.super__Vector_base<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>
        ._M_impl.super__Vector_impl_data._M_start)->num_dimensions;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_80->indexes,
             &(local_c0.
               super__Vector_base<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>.
               _M_impl.super__Vector_impl_data._M_start)->indexes);
  std::vector<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>::~vector(&local_c0);
  return pMVar2;
}

Assistant:

MultiIndexSet generateNonNestedPoints(const MultiIndexSet &tensors, const OneDimensionalWrapper &wrapper){
    size_t num_dimensions = tensors.getNumDimensions();
    int num_tensors = tensors.getNumIndexes();
    std::vector<MultiIndexSet> point_tensors((size_t) num_tensors);

    #pragma omp parallel for
    for(int t=0; t<num_tensors; t++){
        std::vector<int> num_entries(num_dimensions);
        const int *p = tensors.getIndex(t);
        std::transform(p, p + num_dimensions, num_entries.begin(), [&](int l)->int{ return wrapper.getNumPoints(l); });

        int num_total = 1;
        for(auto &l : num_entries) num_total *= l;

        Data2D<int> raw_points(num_dimensions, num_total);
        auto iter = raw_points.rbegin();
        for(int i=num_total-1; i>=0; i--){
            int d = i;
            auto l = num_entries.rbegin();
            // in order to generate indexes in the correct order, the for loop must go backwards
            for(size_t j = 0; j<num_dimensions; j++){
                *iter++ = wrapper.getPointIndex(p[num_dimensions - j - 1], (d % *l));
                d /= *l++;
            }
        }

        point_tensors[t] = MultiIndexSet(raw_points);
    }

    return unionSets(point_tensors);
}